

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr local_40;
  SQInteger local_30;
  SQObjectPtr local_28;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  local_30 = 10;
  SVar4 = sq_gettop(v);
  if (1 < SVar4) {
    sq_getinteger(v,2,&local_30);
  }
  SVar1 = (pSVar3->super_SQObject)._type;
  if ((int)SVar1 < 0x5000004) {
    if (SVar1 == OT_BOOL) {
      local_40.super_SQObject._unVal.nInteger._1_7_ = 0;
      local_40.super_SQObject._unVal.nInteger._0_1_ =
           (pSVar3->super_SQObject)._unVal.pTable != (SQTable *)0x0;
      local_40.super_SQObject._type = OT_INTEGER;
      SQVM::Push(v,&local_40);
      goto LAB_00162399;
    }
    if (SVar1 != OT_INTEGER) goto LAB_0016234f;
  }
  else if (SVar1 != OT_FLOAT) {
    if (SVar1 == OT_STRING) {
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_40.super_SQObject._type = OT_NULL;
      bVar2 = str2num(((pSVar3->super_SQObject)._unVal.pString)->_val,&local_40,local_30);
      if (bVar2) {
        local_28.super_SQObject._unVal = local_40.super_SQObject._unVal;
        if (local_40.super_SQObject._type == OT_FLOAT) {
          local_28.super_SQObject._unVal.nInteger = (long)local_40.super_SQObject._unVal.fFloat;
        }
        local_28.super_SQObject._type = OT_INTEGER;
        SQVM::Push(v,&local_28);
        SQObjectPtr::~SQObjectPtr(&local_28);
        SQObjectPtr::~SQObjectPtr(&local_40);
        if (bVar2) {
          return 1;
        }
      }
      else {
        SQObjectPtr::~SQObjectPtr(&local_40);
      }
      SVar5 = sq_throwerror(v,"cannot convert the string");
      return SVar5;
    }
LAB_0016234f:
    SQVM::PushNull(v);
    return 1;
  }
  if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
    local_40.super_SQObject._unVal.nInteger = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
  }
  else {
    local_40.super_SQObject._unVal = (pSVar3->super_SQObject)._unVal;
  }
  local_40.super_SQObject._type = OT_INTEGER;
  SQVM::Push(v,&local_40);
LAB_00162399:
  SQObjectPtr::~SQObjectPtr(&local_40);
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}